

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_applyCoercionToASTNodeIntoType
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t environment_,
          sysbvm_tuple_t targetType_)

{
  ulong uVar1;
  anon_struct_40_5_5b8d8dc5 gcFrame;
  sysbvm_tuple_t local_80;
  sysbvm_tuple_t local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *psStack_40;
  ulong local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t local_28;
  
  psStack_40 = &local_80;
  local_70 = 0;
  local_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 5;
  local_80 = targetType_;
  local_78 = environment_;
  local_68 = astNode_;
  sysbvm_stackFrame_pushRecord(&local_58);
  if (local_80 == 0) {
    local_80 = (context->roots).decayedTypeInferenceType;
  }
  if (local_80 != (context->roots).directTypeInferenceType) {
    if ((local_68 & 0xf) == 0 && local_68 != 0) {
      local_70 = *(sysbvm_tuple_t *)(local_68 + 0x20);
    }
    else {
      local_70 = 0;
    }
    if (local_80 == (context->roots).decayedTypeInferenceType) {
      local_80 = sysbvm_type_decay(context,local_70);
    }
    else if (local_80 == (context->roots).receiverTypeInferenceType) {
      local_80 = sysbvm_type_decayReceiver(context,local_70);
    }
    if (local_80 != 0) {
      if ((((local_80 & 0xf) == 0) && ((local_70 & 0xf) == 0 && local_70 != 0)) &&
         (uVar1 = local_70, (*(byte *)(local_70 + 8) & 0x80) == 0)) {
        do {
          if (uVar1 == local_80) goto LAB_001226aa;
          uVar1 = *(ulong *)(uVar1 + 0x30);
        } while (uVar1 != 0);
      }
      local_38 = local_80;
      local_30 = local_68;
      local_28 = local_78;
      local_68 = sysbvm_tuple_send(context,(context->roots).coerceASTNodeWithEnvironmentSelector,3,
                                   &local_38,0);
      local_68 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context,local_68,local_78);
    }
  }
LAB_001226aa:
  sysbvm_stackFrame_popRecord(&local_58);
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_applyCoercionToASTNodeIntoType(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t environment_, sysbvm_tuple_t targetType_)
{
    struct {
        sysbvm_tuple_t targetType;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t nodeType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .result = astNode_,
        .targetType = targetType_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    if(!gcFrame.targetType)
        gcFrame.targetType = context->roots.decayedTypeInferenceType;

    // We do not need to perform type checking when just passing the type.
    if(gcFrame.targetType != context->roots.directTypeInferenceType)
    {
        gcFrame.nodeType = sysbvm_astNode_getAnalyzedType(gcFrame.result);
        bool isDecayedType = gcFrame.targetType == context->roots.decayedTypeInferenceType;
        bool isReceiverType = gcFrame.targetType == context->roots.receiverTypeInferenceType;

        if(isDecayedType)
            gcFrame.targetType = sysbvm_type_decay(context, gcFrame.nodeType);
        else if(isReceiverType)
            gcFrame.targetType = sysbvm_type_decayReceiver(context, gcFrame.nodeType);

        if(gcFrame.targetType && !sysbvm_type_isDirectSubtypeOf(gcFrame.nodeType, gcFrame.targetType))
        {
            gcFrame.result = sysbvm_tuple_send2(context, context->roots.coerceASTNodeWithEnvironmentSelector, gcFrame.targetType, gcFrame.result, gcFrame.environment);
            gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.result, gcFrame.environment);
        }
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}